

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  uint uVar5;
  uint *__ptr;
  void *__s;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar13;
  uint *puVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  char Buffer [100];
  uint local_dc;
  void *local_d8;
  double local_c8;
  ulong local_c0;
  char local_98 [104];
  ulong uVar11;
  
  iVar15 = p->nObjData;
  dVar16 = 0.0;
  uVar5 = 10;
  if (iVar15 < 1) {
LAB_00731f42:
    local_dc = 0;
    local_c0 = 0;
    local_c8 = 0.0;
    uVar13 = 0;
  }
  else {
    piVar3 = p->pObjData;
    uVar9 = 0;
    iVar6 = 0;
    iVar7 = 0;
    local_c0 = 0;
    local_dc = 0;
    do {
      if (piVar3 == (int *)0x0) goto LAB_00731f42;
      uVar13 = (ulong)uVar9;
      uVar2 = piVar3[uVar13];
      if ((uVar13 == 0) || ((uVar2 & 3) != 0)) {
        uVar10 = piVar3[uVar13 + 1];
      }
      else {
        uVar12 = uVar2 >> 4;
        uVar10 = piVar3[uVar13 + 1];
        iVar7 = iVar7 + uVar12;
        iVar6 = iVar6 + uVar10;
        if (local_dc <= uVar12) {
          local_dc = uVar12;
        }
        if ((int)local_c0 <= (int)uVar10) {
          local_c0 = (ulong)uVar10;
        }
      }
      uVar9 = uVar9 + (uVar2 >> 4) + uVar10 + 5;
    } while ((int)uVar9 < iVar15);
    uVar5 = local_dc;
    if (1 < local_dc) {
      uVar13 = (ulong)(local_dc - 1);
      uVar5 = 0;
      do {
        uVar9 = (uint)uVar13;
        uVar13 = uVar13 / 10;
        uVar5 = uVar5 + 1;
      } while (9 < uVar9);
    }
    dVar16 = (double)iVar7;
    local_c8 = (double)iVar6;
    uVar5 = uVar5 * 10 + 10;
    uVar13 = local_c0;
    if (1 < (uint)local_c0) {
      uVar13 = 0;
      uVar9 = (uint)local_c0 - 1;
      do {
        uVar13 = (ulong)((int)uVar13 + 1);
        bVar4 = 9 < uVar9;
        uVar9 = uVar9 / 10;
      } while (bVar4);
    }
  }
  uVar9 = (int)uVar13 * 10 + 10;
  if ((int)uVar9 < (int)uVar5) {
    uVar9 = uVar5;
  }
  uVar5 = 0x10;
  if (0xe < uVar9 - 1) {
    uVar5 = uVar9;
  }
  if (uVar5 == 0) {
    __ptr = (uint *)malloc(0x10);
    *__ptr = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar9;
    __s = (void *)0x0;
    local_d8 = (void *)0x0;
  }
  else {
    local_d8 = malloc((long)(int)uVar5 << 2);
    if (local_d8 != (void *)0x0) {
      memset(local_d8,0,(long)(int)uVar9 * 4);
    }
    __ptr = (uint *)malloc(0x10);
    *__ptr = uVar5;
    __s = malloc((long)(int)uVar5 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = uVar9;
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)(int)uVar9 << 2);
    }
  }
  puVar14 = __ptr + 1;
  if ((0 < iVar15) && (piVar3 = p->pObjData, piVar3 != (int *)0x0)) {
    uVar13 = 0;
    do {
      if (((int)uVar13 != 0) && (uVar5 = piVar3[uVar13], (uVar5 & 3) == 0)) {
        uVar10 = uVar5 >> 4;
        uVar11 = (ulong)uVar10;
        uVar2 = piVar3[uVar13 + 1];
        uVar8 = (ulong)uVar2;
        if (uVar5 < 0xa0) {
LAB_007320bf:
          if ((int)uVar9 <= (int)uVar11) goto LAB_00732491;
LAB_007320c8:
          piVar1 = (int *)((long)local_d8 + uVar11 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar5 < 0x640) {
            uVar11 = (ulong)(byte)((char)((uVar10 & 0xff) / 10) + 10);
            goto LAB_007320bf;
          }
          if (uVar5 < 16000) {
            uVar5 = (uVar10 & 0xffff) / 100 + 0x14;
LAB_0073215b:
            if ((int)uVar9 <= (int)uVar5) goto LAB_00732491;
            uVar11 = (ulong)uVar5;
            goto LAB_007320c8;
          }
          if (uVar5 < 160000) {
            uVar5 = (uVar10 & 0xffff) / 1000 + 0x1e;
            goto LAB_0073215b;
          }
          if (uVar5 < 1600000) {
            uVar5 = uVar5 / 160000 + 0x28;
LAB_00732211:
            if ((int)uVar9 <= (int)uVar5) goto LAB_00732491;
            uVar11 = (ulong)uVar5;
            goto LAB_007320c8;
          }
          if (uVar5 < 16000000) {
            uVar5 = uVar5 / 1600000 + 0x32;
            goto LAB_00732211;
          }
          if (uVar5 < 160000000) {
            uVar5 = uVar5 / 16000000 + 0x3c;
            goto LAB_00732211;
          }
        }
        if ((int)uVar2 < 10) {
          if ((int)uVar2 < 0) goto LAB_00732491;
LAB_007320f9:
          if ((int)*puVar14 <= (int)uVar8) {
LAB_00732491:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
        }
        else {
          if (uVar2 < 100) {
            uVar8 = (ulong)(byte)((char)((uVar2 & 0xff) / 10) + 10);
            goto LAB_007320f9;
          }
          if (uVar2 < 1000) {
            uVar5 = (uVar2 & 0xffff) / 100 + 0x14;
LAB_00732186:
            if ((int)*puVar14 <= (int)uVar5) goto LAB_00732491;
            uVar8 = (ulong)uVar5;
          }
          else {
            if (uVar2 < 10000) {
              uVar5 = (uVar2 & 0xffff) / 1000 + 0x1e;
              goto LAB_00732186;
            }
            if (uVar2 < 100000) {
              uVar5 = uVar2 / 10000 + 0x28;
            }
            else if (uVar2 < 1000000) {
              uVar5 = uVar2 / 100000 + 0x32;
            }
            else {
              if (9999999 < uVar2) goto LAB_00732245;
              uVar5 = uVar2 / 1000000 + 0x3c;
            }
            if ((int)*puVar14 <= (int)uVar5) goto LAB_00732491;
            uVar8 = (ulong)uVar5;
          }
        }
        piVar1 = (int *)((long)__s + uVar8 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_00732245:
      uVar5 = ((uint)piVar3[uVar13] >> 4) + (int)uVar13 + piVar3[uVar13 + 1] + 5;
      uVar13 = (ulong)uVar5;
    } while ((int)uVar5 < p->nObjData);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if ((int)uVar9 < 1) {
    if (local_d8 == (void *)0x0) goto LAB_007323f8;
  }
  else {
    uVar13 = 0;
    do {
      if ((*(int *)((long)local_d8 + uVar13 * 4) != 0) ||
         (*(int *)(*(long *)(__ptr + 2) + uVar13 * 4) != 0)) {
        if (uVar13 < 10) {
          printf("%15d : ",uVar13 & 0xffffffff);
        }
        else {
          iVar15 = (int)((uVar13 & 0xffffffff) / 10) * -10;
          dVar17 = (double)(int)((uVar13 & 0xffffffff) / 10);
          dVar18 = pow(10.0,dVar17);
          dVar17 = pow(10.0,dVar17);
          sprintf(local_98,"%d - %d",(ulong)(uint)((iVar15 + (int)uVar13) * (int)dVar18),
                  (ulong)((iVar15 + (int)uVar13 + 1) * (int)dVar17 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_d8 + uVar13 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)(*(long *)(__ptr + 2) + uVar13 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  free(local_d8);
LAB_007323f8:
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  dVar18 = (double)(p->nObjs - (p->vCis->nSize + p->vCos->nSize));
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",dVar16 / dVar18,
         local_c8 / dVar18,(ulong)local_dc,local_c0);
  return;
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}